

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O2

wchar_t count_interesting_shapes(void)

{
  int iVar1;
  wchar_t wVar2;
  player_shape **pppVar3;
  
  pppVar3 = &shapes;
  wVar2 = L'\0';
  while (pppVar3 = &((player_shape *)pppVar3)->next->next,
        (player_shape *)pppVar3 != (player_shape *)0x0) {
    iVar1 = strcmp(((player_shape *)pppVar3)->name,"normal");
    wVar2 = (wVar2 + L'\x01') - (uint)(iVar1 == 0);
  }
  return wVar2;
}

Assistant:

static int count_interesting_shapes(void)
{
	int count = 0;
	struct player_shape *s;

	for (s = shapes; s; s = s->next) {
		if (! streq(s->name, "normal")) {
			++count;
		}
	}

	return count;
}